

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

json_token * parse_json2(char *s,int s_len)

{
  int iVar1;
  undefined1 local_40 [8];
  frozen frozen;
  int s_len_local;
  char *s_local;
  
  frozen._36_4_ = s_len;
  memset(local_40,0,0x28);
  local_40 = (undefined1  [8])(s + (int)frozen._36_4_);
  frozen.max_tokens = 1;
  frozen.end = s;
  iVar1 = doit((frozen *)local_40);
  if (iVar1 < 0) {
    free(frozen.cur);
    frozen.cur = (char *)0x0;
  }
  return (json_token *)frozen.cur;
}

Assistant:

struct json_token *parse_json2(const char *s, int s_len) {
    struct frozen frozen;

    memset(&frozen, 0, sizeof(frozen));
    frozen.end = s + s_len;
    frozen.cur = s;
    frozen.do_realloc = 1;

    if (doit(&frozen) < 0) {
        FROZEN_FREE((void *) frozen.tokens);
        frozen.tokens = NULL;
    }
    return frozen.tokens;
}